

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_graph_quantity.cpp
# Opt level: O2

string * __thiscall
polyscope::SurfaceGraphQuantity::niceName_abi_cxx11_
          (string *__return_storage_ptr__,SurfaceGraphQuantity *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             &(this->super_SurfaceMeshQuantity).super_Quantity<polyscope::SurfaceMesh>.name);
  return __return_storage_ptr__;
}

Assistant:

std::string SurfaceGraphQuantity::niceName() { return name; }